

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void typecheck_functions_should_check_type(void)

{
  long lVar1;
  cJSON_bool cVar2;
  long in_FS_OFFSET;
  undefined1 local_98 [8];
  cJSON item [1];
  cJSON invalid [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  item[0].child._0_4_ = 0x201;
  cVar2 = cJSON_IsInvalid((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xa1);
  }
  cVar2 = cJSON_IsInvalid((cJSON *)local_98);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xa2);
  }
  cVar2 = cJSON_IsInvalid((cJSON *)&item[0].string);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xa3);
  }
  item[0].child._0_4_ = 0x201;
  cVar2 = cJSON_IsFalse((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xa6);
  }
  cVar2 = cJSON_IsFalse((cJSON *)&item[0].string);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xa7);
  }
  cVar2 = cJSON_IsFalse((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xa8);
  }
  cVar2 = cJSON_IsBool((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xa9);
  }
  item[0].child._0_4_ = 0x202;
  cVar2 = cJSON_IsTrue((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xac);
  }
  cVar2 = cJSON_IsTrue((cJSON *)&item[0].string);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xad);
  }
  cVar2 = cJSON_IsTrue((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xae);
  }
  cVar2 = cJSON_IsBool((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xaf);
  }
  item[0].child._0_4_ = 0x204;
  cVar2 = cJSON_IsNull((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xb2);
  }
  cVar2 = cJSON_IsNull((cJSON *)&item[0].string);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xb3);
  }
  cVar2 = cJSON_IsNull((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xb4);
  }
  item[0].child._0_4_ = 0x208;
  cVar2 = cJSON_IsNumber((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xb7);
  }
  cVar2 = cJSON_IsNumber((cJSON *)&item[0].string);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xb8);
  }
  cVar2 = cJSON_IsNumber((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xb9);
  }
  item[0].child._0_4_ = 0x210;
  cVar2 = cJSON_IsString((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xbc);
  }
  cVar2 = cJSON_IsString((cJSON *)&item[0].string);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xbd);
  }
  cVar2 = cJSON_IsString((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xbe);
  }
  item[0].child._0_4_ = 0x220;
  cVar2 = cJSON_IsArray((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xc1);
  }
  cVar2 = cJSON_IsArray((cJSON *)&item[0].string);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xc2);
  }
  cVar2 = cJSON_IsArray((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xc3);
  }
  item[0].child._0_4_ = 0x240;
  cVar2 = cJSON_IsObject((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xc6);
  }
  cVar2 = cJSON_IsObject((cJSON *)&item[0].string);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",199);
  }
  cVar2 = cJSON_IsObject((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",200);
  }
  item[0].child._0_4_ = 0x280;
  cVar2 = cJSON_IsRaw((cJSON *)0x0);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xcb);
  }
  cVar2 = cJSON_IsRaw((cJSON *)&item[0].string);
  if (cVar2 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0xcc);
  }
  cVar2 = cJSON_IsRaw((cJSON *)local_98);
  if (cVar2 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0xcd);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void typecheck_functions_should_check_type(void)
{
    cJSON invalid[1];
    cJSON item[1];
    invalid->type = cJSON_Invalid;
    invalid->type |= cJSON_StringIsConst;
    item->type = cJSON_False;
    item->type |= cJSON_StringIsConst;

    TEST_ASSERT_FALSE(cJSON_IsInvalid(NULL));
    TEST_ASSERT_FALSE(cJSON_IsInvalid(item));
    TEST_ASSERT_TRUE(cJSON_IsInvalid(invalid));

    item->type = cJSON_False | cJSON_StringIsConst;
    TEST_ASSERT_FALSE(cJSON_IsFalse(NULL));
    TEST_ASSERT_FALSE(cJSON_IsFalse(invalid));
    TEST_ASSERT_TRUE(cJSON_IsFalse(item));
    TEST_ASSERT_TRUE(cJSON_IsBool(item));

    item->type = cJSON_True | cJSON_StringIsConst;
    TEST_ASSERT_FALSE(cJSON_IsTrue(NULL));
    TEST_ASSERT_FALSE(cJSON_IsTrue(invalid));
    TEST_ASSERT_TRUE(cJSON_IsTrue(item));
    TEST_ASSERT_TRUE(cJSON_IsBool(item));

    item->type = cJSON_NULL | cJSON_StringIsConst;
    TEST_ASSERT_FALSE(cJSON_IsNull(NULL));
    TEST_ASSERT_FALSE(cJSON_IsNull(invalid));
    TEST_ASSERT_TRUE(cJSON_IsNull(item));

    item->type = cJSON_Number | cJSON_StringIsConst;
    TEST_ASSERT_FALSE(cJSON_IsNumber(NULL));
    TEST_ASSERT_FALSE(cJSON_IsNumber(invalid));
    TEST_ASSERT_TRUE(cJSON_IsNumber(item));

    item->type = cJSON_String | cJSON_StringIsConst;
    TEST_ASSERT_FALSE(cJSON_IsString(NULL));
    TEST_ASSERT_FALSE(cJSON_IsString(invalid));
    TEST_ASSERT_TRUE(cJSON_IsString(item));

    item->type = cJSON_Array | cJSON_StringIsConst;
    TEST_ASSERT_FALSE(cJSON_IsArray(NULL));
    TEST_ASSERT_FALSE(cJSON_IsArray(invalid));
    TEST_ASSERT_TRUE(cJSON_IsArray(item));

    item->type = cJSON_Object | cJSON_StringIsConst;
    TEST_ASSERT_FALSE(cJSON_IsObject(NULL));
    TEST_ASSERT_FALSE(cJSON_IsObject(invalid));
    TEST_ASSERT_TRUE(cJSON_IsObject(item));

    item->type = cJSON_Raw | cJSON_StringIsConst;
    TEST_ASSERT_FALSE(cJSON_IsRaw(NULL));
    TEST_ASSERT_FALSE(cJSON_IsRaw(invalid));
    TEST_ASSERT_TRUE(cJSON_IsRaw(item));
}